

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern.c
# Opt level: O0

xmlPatternPtr xmlNewPattern(void)

{
  xmlPatternPtr cur;
  
  cur = (xmlPatternPtr)(*xmlMalloc)(0x40);
  if (cur == (xmlPatternPtr)0x0) {
    cur = (xmlPatternPtr)0x0;
  }
  else {
    memset(cur,0,0x40);
    cur->steps = (xmlStepOpPtr)0x0;
    cur->maxStep = 0;
  }
  return cur;
}

Assistant:

static xmlPatternPtr
xmlNewPattern(void) {
    xmlPatternPtr cur;

    cur = (xmlPatternPtr) xmlMalloc(sizeof(xmlPattern));
    if (cur == NULL) {
	ERROR(NULL, NULL, NULL,
		"xmlNewPattern : malloc failed\n");
	return(NULL);
    }
    memset(cur, 0, sizeof(xmlPattern));
    cur->steps = NULL;
    cur->maxStep = 0;
    return(cur);
}